

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsInstPrinter.c
# Opt level: O0

void printRegisterList(MCInst *MI,int opNum,SStream *O)

{
  cs_detail *pcVar1;
  uint uVar2;
  uint i_00;
  MCOperand *op;
  uint8_t *puVar3;
  uint in_ESI;
  MCInst *in_RDI;
  int reg;
  int e;
  int i;
  undefined4 in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffdc;
  
  i_00 = in_ESI;
  uVar2 = MCInst_getNumOperands(in_RDI);
  uVar2 = uVar2 - 2;
  for (; i_00 != uVar2; i_00 = i_00 + 1) {
    if (i_00 != in_ESI) {
      SStream_concat0((SStream *)CONCAT44(i_00,uVar2),
                      (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    }
    op = MCInst_getOperand(in_RDI,i_00);
    in_stack_ffffffffffffffdc = MCOperand_getReg(op);
    printRegName((SStream *)CONCAT44(i_00,uVar2),in_stack_ffffffffffffffdc);
    if (in_RDI->csh->detail != CS_OPT_OFF) {
      puVar3 = in_RDI->flat_insn->detail->groups +
               (ulong)(in_RDI->flat_insn->detail->field_6).x86.prefix[0] * 0x18 + 0x15;
      puVar3[0] = '\x01';
      puVar3[1] = '\0';
      puVar3[2] = '\0';
      puVar3[3] = '\0';
      *(uint *)(in_RDI->flat_insn->detail->groups +
               (ulong)(in_RDI->flat_insn->detail->field_6).x86.prefix[0] * 0x18 + 0x1d) =
           in_stack_ffffffffffffffdc;
      pcVar1 = in_RDI->flat_insn->detail;
      (pcVar1->field_6).x86.prefix[0] = (pcVar1->field_6).x86.prefix[0] + '\x01';
    }
  }
  return;
}

Assistant:

static void printRegisterList(MCInst *MI, int opNum, SStream *O)
{
	int i, e, reg;

	// - 2 because register List is always first operand of instruction and it is
	// always followed by memory operand (base + offset).
	for (i = opNum, e = MCInst_getNumOperands(MI) - 2; i != e; ++i) {
		if (i != opNum)
			SStream_concat0(O, ", ");
		reg = MCOperand_getReg(MCInst_getOperand(MI, i));
		printRegName(O, reg);
		if (MI->csh->detail) {
			MI->flat_insn->detail->mips.operands[MI->flat_insn->detail->mips.op_count].type = MIPS_OP_REG;
			MI->flat_insn->detail->mips.operands[MI->flat_insn->detail->mips.op_count].reg = reg;
			MI->flat_insn->detail->mips.op_count++;
		}
	}
}